

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O0

char * u_austrncpy_63(char *s1,UChar *ucs2,int32_t n)

{
  UChar *pUVar1;
  UBool UVar2;
  int32_t iVar3;
  UConverter *converter;
  char *targetLimit;
  UConverter *cnv;
  char *pcStack_28;
  UErrorCode err;
  char *target;
  UChar *pUStack_18;
  int32_t n_local;
  UChar *ucs2_local;
  char *s1_local;
  
  cnv._4_4_ = U_ZERO_ERROR;
  pcStack_28 = s1;
  target._4_4_ = n;
  pUStack_18 = ucs2;
  ucs2_local = (UChar *)s1;
  converter = u_getDefaultConverter_63((UErrorCode *)((long)&cnv + 4));
  UVar2 = U_SUCCESS(cnv._4_4_);
  if ((UVar2 == '\0') || (converter == (UConverter *)0x0)) {
    *(undefined1 *)ucs2_local = 0;
  }
  else {
    ucnv_reset_63(converter);
    pUVar1 = pUStack_18;
    targetLimit = (char *)((long)ucs2_local + (long)target._4_4_);
    iVar3 = u_ustrnlen(pUStack_18,target._4_4_);
    ucnv_fromUnicode_63(converter,&stack0xffffffffffffffd8,targetLimit,&stack0xffffffffffffffe8,
                        pUVar1 + iVar3,(int32_t *)0x0,'\x01',(UErrorCode *)((long)&cnv + 4));
    ucnv_reset_63(converter);
    u_releaseDefaultConverter_63(converter);
    UVar2 = U_FAILURE(cnv._4_4_);
    if ((UVar2 != '\0') && (cnv._4_4_ != U_BUFFER_OVERFLOW_ERROR)) {
      *(undefined1 *)ucs2_local = 0;
    }
    if (pcStack_28 < (char *)((long)ucs2_local + (long)target._4_4_)) {
      *pcStack_28 = '\0';
    }
  }
  return (char *)ucs2_local;
}

Assistant:

U_CAPI char*  U_EXPORT2
u_austrncpy(char *s1,
        const UChar *ucs2,
        int32_t n)
{
  char *target = s1;
  UErrorCode err = U_ZERO_ERROR;
  UConverter *cnv = u_getDefaultConverter(&err);
  if(U_SUCCESS(err) && cnv != NULL) {
    ucnv_reset(cnv);
    ucnv_fromUnicode(cnv,
                  &target,
                  s1+n,
                  &ucs2,
                  ucs2+u_ustrnlen(ucs2, n),
                  NULL,
                  TRUE,
                  &err);
    ucnv_reset(cnv); /* be good citizens */
    u_releaseDefaultConverter(cnv);
    if(U_FAILURE(err) && (err != U_BUFFER_OVERFLOW_ERROR) ) {
      *s1 = 0; /* failure */
    }
    if(target < (s1+n)) { /* U_BUFFER_OVERFLOW_ERROR isn't an err, just means no termination will happen. */
      *target = 0;  /* terminate */
    }
  } else {
    *s1 = 0;
  }
  return s1;
}